

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall ON_Xform::operator==(ON_Xform *this,ON_Xform *rhs)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  double *y;
  double *x;
  
  uVar3 = 0;
  while (uVar4 = uVar3, uVar4 < 0x80) {
    dVar2 = *(double *)((long)this->m_xform[0] + uVar4);
    pdVar1 = (double *)((long)rhs->m_xform[0] + uVar4);
    if ((dVar2 != *pdVar1) || (uVar3 = uVar4 + 8, NAN(dVar2) || NAN(*pdVar1))) break;
  }
  return 0x7f < uVar4;
}

Assistant:

bool ON_Xform::operator==(const ON_Xform& rhs) const
{
  // Intentionally returns false if any coefficient is a nan.
  const double* x = &m_xform[0][0];
  const double* x16 = x + 16;
  const double* y = &rhs.m_xform[0][0];
  while (x < x16)
  {
    if (*x++ == *y++)
      continue;
    return false; // not equal or a nan
  }
  return true;
}